

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Read_From_File_And_Create_Objects<Doctor>
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Humans,fstream *inFile)

{
  string password;
  string password_00;
  string password_01;
  string age;
  string age_00;
  string age_01;
  string field;
  string field_00;
  string field_01;
  string day;
  string day_00;
  string day_01;
  string time;
  string time_00;
  string time_01;
  long lVar1;
  ostream *poVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff9b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  undefined8 uStack_620;
  istream *local_618;
  vector<Doctor,_std::allocator<Doctor>_> *local_610;
  string item;
  string local_5e8 [16];
  string in_stack_fffffffffffffa28;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string s;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228;
  string local_208;
  string local_1e8 [32];
  string local_1c8 [32];
  Doctor New_Nurse;
  
  local_610 = All_Of_Humans;
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(1);
  }
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&s,"6Doctor",(allocator *)&New_Nurse);
  iVar3 = 0;
  local_618 = (istream *)inFile;
  do {
    if (((byte)local_618[*(long *)(*(long *)local_618 + -0x18) + 0x20] & 2) != 0) {
      std::__cxx11::string::~string((string *)&s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&temp);
      std::__cxx11::string::~string((string *)&item);
      return;
    }
    std::operator>>(local_618,(string *)&item);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&temp,&item);
    lVar1 = std::__cxx11::string::find((char *)&s,0x11d84d);
    if (iVar3 == 9 && lVar1 != -1) {
      std::__cxx11::string::string
                ((string *)&local_208,
                 (string *)
                 temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::string
                ((string *)&local_4e8,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      std::__cxx11::string::string
                ((string *)&local_228,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2));
      std::__cxx11::string::string
                ((string *)&local_508,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3));
      std::__cxx11::string::string
                ((string *)&local_528,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4));
      std::__cxx11::string::string
                (local_248,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 5));
      std::__cxx11::string::string
                (local_268,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 6));
      std::__cxx11::string::string
                (local_288,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 7));
      std::__cxx11::string::string
                (local_2a8,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 8));
      std::__cxx11::string::string
                (local_2c8,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 9));
      std::__cxx11::string::string(local_2e8,"salam",(allocator *)&stack0xfffffffffffff9c7);
      password._M_string_length = (size_type)local_268;
      password._M_dataplus._M_p = (pointer)local_248;
      password.field_2._M_allocated_capacity = (size_type)local_288;
      password.field_2._8_8_ = local_2a8;
      age._M_string_length = (size_type)local_2e8;
      age._M_dataplus._M_p = (pointer)local_2c8;
      age.field_2 = in_stack_fffffffffffff9b8;
      field._M_string_length =
           (size_type)
           temp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      field._M_dataplus._M_p =
           (pointer)temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      field.field_2._M_allocated_capacity =
           (size_type)
           temp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      field.field_2._8_8_ = uStack_620;
      day._M_string_length = (size_type)local_610;
      day._M_dataplus._M_p = (pointer)local_618;
      day.field_2._M_allocated_capacity = (size_type)item._M_dataplus._M_p;
      day.field_2._8_8_ = item._M_string_length;
      time._1_31_ = stack0xfffffffffffffa09;
      time._M_dataplus._M_p._0_1_ = item.field_2._M_local_buf[0];
      Doctor::Doctor(&New_Nurse,&local_208,&local_4e8,&local_228,&local_508,&local_528,password,age,
                     field,day,time,in_stack_fffffffffffffa28);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::vector<Doctor,_std::allocator<Doctor>_>::push_back(local_610,&New_Nurse);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&temp);
      Doctor::~Doctor(&New_Nurse);
      iVar3 = -1;
    }
    else {
      lVar1 = std::__cxx11::string::find((char *)&s,0x11d859);
      if (iVar3 == 10 && lVar1 != -1) {
        std::__cxx11::string::string
                  ((string *)&local_308,
                   (string *)
                   temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::string
                  (local_5e8,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        std::__cxx11::string::string
                  ((string *)&local_548,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
        std::__cxx11::string::string
                  ((string *)&local_568,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3));
        std::__cxx11::string::string
                  ((string *)&local_588,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4));
        std::__cxx11::string::string
                  (local_328,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 5));
        std::__cxx11::string::string
                  (local_348,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 6));
        std::__cxx11::string::string
                  (local_368,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 7));
        std::__cxx11::string::string
                  (local_388,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8));
        std::__cxx11::string::string
                  (local_3a8,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 9));
        std::__cxx11::string::string
                  (local_1c8,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 10));
        password_00._M_string_length = (size_type)local_348;
        password_00._M_dataplus._M_p = (pointer)local_328;
        password_00.field_2._M_allocated_capacity = (size_type)local_368;
        password_00.field_2._8_8_ = local_388;
        age_00._M_string_length = (size_type)local_1c8;
        age_00._M_dataplus._M_p = (pointer)local_3a8;
        age_00.field_2 = in_stack_fffffffffffff9b8;
        field_00._M_string_length =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        field_00._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        field_00.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        field_00.field_2._8_8_ = uStack_620;
        day_00._M_string_length = (size_type)local_610;
        day_00._M_dataplus._M_p = (pointer)local_618;
        day_00.field_2._M_allocated_capacity = (size_type)item._M_dataplus._M_p;
        day_00.field_2._8_8_ = item._M_string_length;
        time_00._1_31_ = stack0xfffffffffffffa09;
        time_00._M_dataplus._M_p._0_1_ = item.field_2._M_local_buf[0];
        Doctor::Doctor(&New_Nurse,&local_308,(string *)local_5e8,&local_548,&local_568,&local_588,
                       password_00,age_00,field_00,day_00,time_00,in_stack_fffffffffffffa28);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string(local_3a8);
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string(local_5e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::vector<Doctor,_std::allocator<Doctor>_>::push_back(local_610,&New_Nurse);
      }
      else {
        lVar1 = std::__cxx11::string::find((char *)&s,0x11d860);
        if (iVar3 != 7 || lVar1 == -1) goto LAB_00116ebd;
        std::__cxx11::string::string
                  ((string *)&local_3c8,
                   (string *)
                   temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::string
                  ((string *)&local_3e8,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        std::__cxx11::string::string
                  ((string *)&local_408,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
        std::__cxx11::string::string
                  ((string *)&local_5a8,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3));
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffa38,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4));
        std::__cxx11::string::string
                  (local_428,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 5));
        std::__cxx11::string::string
                  (local_448,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 6));
        std::__cxx11::string::string
                  (local_468,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 7));
        std::__cxx11::string::string(local_488,"salam1",(allocator *)&stack0xfffffffffffff9c7);
        std::__cxx11::string::string(local_4a8,"salam1",(allocator *)((long)&uStack_620 + 7));
        std::__cxx11::string::string(local_1e8,"salam2",(allocator *)((long)&uStack_620 + 6));
        password_01._M_string_length = (size_type)local_448;
        password_01._M_dataplus._M_p = (pointer)local_428;
        password_01.field_2._M_allocated_capacity = (size_type)local_468;
        password_01.field_2._8_8_ = local_488;
        age_01._M_string_length = (size_type)local_1e8;
        age_01._M_dataplus._M_p = (pointer)local_4a8;
        age_01.field_2 = in_stack_fffffffffffff9b8;
        field_01._M_string_length =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        field_01._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        field_01.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        field_01.field_2._8_8_ = uStack_620;
        day_01._M_string_length = (size_type)local_610;
        day_01._M_dataplus._M_p = (pointer)local_618;
        day_01.field_2._M_allocated_capacity = (size_type)item._M_dataplus._M_p;
        day_01.field_2._8_8_ = item._M_string_length;
        time_01._1_31_ = stack0xfffffffffffffa09;
        time_01._M_dataplus._M_p._0_1_ = item.field_2._M_local_buf[0];
        Doctor::Doctor(&New_Nurse,&local_3c8,&local_3e8,&local_408,&local_5a8,
                       (string *)&stack0xfffffffffffffa38,password_01,age_01,field_01,day_01,time_01
                       ,in_stack_fffffffffffffa28);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::string::~string(local_488);
        std::__cxx11::string::~string(local_468);
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffa38);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::vector<Doctor,_std::allocator<Doctor>_>::push_back(local_610,&New_Nurse);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&temp);
      Doctor::~Doctor(&New_Nurse);
      iVar3 = -1;
    }
LAB_00116ebd:
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Hospital::Read_From_File_And_Create_Objects (vector<T>& All_Of_Humans , fstream& inFile){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    int counter = 0 ;
    string item;
    vector<string>temp;
    string s=typeid(T).name();
    while(!inFile.eof()){

        inFile >> item ;
        temp.push_back(item);
        if(s.find("Nurse")!=string::npos && counter == 9){

            T New_Nurse(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                        temp[9] ,"salam");
            All_Of_Humans.push_back(New_Nurse);
            temp.clear();
            counter = -1;

        }
        else if(s.find("Doctor")!=string::npos  && counter == 10) {

            T New_Doctor(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                         temp[9], temp[10] );

            All_Of_Humans.push_back(New_Doctor);
            temp.clear();
            counter =-1;

        }
        else if (s.find("Patient")!=string::npos  && counter == 7) {

            T New_Patient(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7],"salam1","salam1","salam2"
            );
            All_Of_Humans.push_back(New_Patient);
            temp.clear();
            counter = -1;
        }

        counter++;

    }
}